

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deserializer.hpp
# Opt level: O3

type * __thiscall
duckdb::Deserializer::
Read<std::unordered_map<unsigned_long,unsigned_long,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>>>
          (type *__return_storage_ptr__,Deserializer *this)

{
  int iVar1;
  key_type in_RAX;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  mapped_type *pmVar2;
  long lVar3;
  unsigned_long key;
  key_type local_38;
  
  (__return_storage_ptr__->_M_h)._M_buckets = &(__return_storage_ptr__->_M_h)._M_single_bucket;
  (__return_storage_ptr__->_M_h)._M_bucket_count = 1;
  (__return_storage_ptr__->_M_h)._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (__return_storage_ptr__->_M_h)._M_element_count = 0;
  (__return_storage_ptr__->_M_h)._M_rehash_policy._M_max_load_factor = 1.0;
  (__return_storage_ptr__->_M_h)._M_rehash_policy._M_next_resize = 0;
  (__return_storage_ptr__->_M_h)._M_single_bucket = (__node_base_ptr)0x0;
  local_38 = in_RAX;
  iVar1 = (*this->_vptr_Deserializer[8])(this);
  for (lVar3 = CONCAT44(extraout_var,iVar1); lVar3 != 0; lVar3 = lVar3 + -1) {
    (*this->_vptr_Deserializer[6])(this);
    (*this->_vptr_Deserializer[2])(this,0,"key");
    iVar1 = (*this->_vptr_Deserializer[0x15])(this);
    (*this->_vptr_Deserializer[3])(this);
    local_38 = CONCAT44(extraout_var_00,iVar1);
    (*this->_vptr_Deserializer[2])(this,1,"value");
    iVar1 = (*this->_vptr_Deserializer[0x15])(this);
    (*this->_vptr_Deserializer[3])(this);
    (*this->_vptr_Deserializer[7])(this);
    pmVar2 = ::std::__detail::
             _Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)__return_storage_ptr__,&local_38);
    *pmVar2 = CONCAT44(extraout_var_01,iVar1);
  }
  (*this->_vptr_Deserializer[9])(this);
  return __return_storage_ptr__;
}

Assistant:

inline typename std::enable_if<is_unordered_map<T>::value, T>::type Read() {
		using KEY_TYPE = typename is_unordered_map<T>::KEY_TYPE;
		using VALUE_TYPE = typename is_unordered_map<T>::VALUE_TYPE;

		T map;
		auto size = OnListBegin();
		for (idx_t i = 0; i < size; i++) {
			OnObjectBegin();
			auto key = ReadProperty<KEY_TYPE>(0, "key");
			auto value = ReadProperty<VALUE_TYPE>(1, "value");
			OnObjectEnd();
			map[std::move(key)] = std::move(value);
		}
		OnListEnd();
		return map;
	}